

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void dmrC_kill_use(dmr_C *C,pseudo_t *usep)

{
  pseudo_t ppVar1;
  int iVar2;
  void *pvVar3;
  undefined1 local_40 [8];
  ptr_list_iter puiter__;
  
  if (usep != (pseudo_t *)0x0) {
    ppVar1 = *usep;
    *usep = &C->L->void_pseudo;
    if (((ppVar1 != (pseudo_t)0x0) && (ppVar1->type != PSEUDO_VOID)) && (ppVar1->type != PSEUDO_VAL)
       ) {
      ptrlist_forward_iterator((ptr_list_iter *)local_40,(ptr_list *)ppVar1->users);
      do {
        pvVar3 = ptrlist_iter_next((ptr_list_iter *)local_40);
        if (pvVar3 == (void *)0x0) {
          __assert_fail("count <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                        ,0x9b8,
                        "int delete_pseudo_user_list_entry(struct dmr_C *, struct pseudo_user_list **, pseudo_t *, int)"
                       );
        }
      } while (*(pseudo_t **)((long)pvVar3 + 8) != usep);
      ptrlist_iter_mark_deleted((ptr_list_iter *)local_40);
      iVar2 = ptrlist_size((ptr_list *)ppVar1->users);
      if (iVar2 == 0) {
        ppVar1->users = (pseudo_user_list *)0x0;
      }
      else if (ppVar1->users != (pseudo_user_list *)0x0) {
        return;
      }
      dmrC_kill_instruction(C,(ppVar1->field_5).def);
    }
  }
  return;
}

Assistant:

void dmrC_kill_use(struct dmr_C *C, pseudo_t *usep)
{
	if (usep) {
		pseudo_t p = *usep;
		*usep = VOID_PSEUDO(C);
		remove_usage(C, p, usep);
	}
}